

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_window_set_bounds(nk_context *ctx,char *name,nk_rect bounds)

{
  nk_window *pnVar1;
  float local_18;
  float fStack_14;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x40c1,
                  "void nk_window_set_bounds(struct nk_context *, const char *, struct nk_rect)");
  }
  pnVar1 = nk_window_find(ctx,name);
  if (pnVar1 != (nk_window *)0x0) {
    if (ctx->current == pnVar1) {
      __assert_fail("ctx->current != win && \"You cannot update a currently in procecss window\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x40c5,
                    "void nk_window_set_bounds(struct nk_context *, const char *, struct nk_rect)");
    }
    local_18 = bounds.x;
    fStack_14 = bounds.y;
    (pnVar1->bounds).x = local_18;
    (pnVar1->bounds).y = fStack_14;
    (pnVar1->bounds).w = bounds.w;
    (pnVar1->bounds).h = bounds.h;
  }
  return;
}

Assistant:

NK_API void
nk_window_set_bounds(struct nk_context *ctx,
    const char *name, struct nk_rect bounds)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;
    win = nk_window_find(ctx, name);
    if (!win) return;
    NK_ASSERT(ctx->current != win && "You cannot update a currently in procecss window");
    win->bounds = bounds;
}